

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qp2passes.hpp
# Opt level: O2

QP2PassNodeResult __thiscall mp::QP2PassVisitor::DoVisitPow2(QP2PassVisitor *this,Expr expr)

{
  bool bVar1;
  QP2PassNodeResult QVar2;
  int iVar3;
  AffineExpr aeL;
  
  if (*(int *)expr.super_ExprBase.impl_ == 1) {
    DoAddConst(this,(longdouble)*(double *)((long)expr.super_ExprBase.impl_ + 8) *
                    this->factor_ * (longdouble)*(double *)((long)expr.super_ExprBase.impl_ + 8));
    iVar3 = 0;
  }
  else {
    aeL.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)&aeL.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
               m_storage;
    aeL.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    aeL.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
    super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
    aeL.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    aeL.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&aeL.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
               m_storage;
    aeL.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
    aeL.constant_term_ = 0.0;
    QVar2 = VisitAtmostAffine(this,expr,&aeL);
    iVar3 = 1000;
    if (QVar2 * 2 <= this->mode_) {
      if (QVar2 == 0) {
        DoAddConst(this,(longdouble)aeL.constant_term_ *
                        this->factor_ * (longdouble)aeL.constant_term_);
        iVar3 = 0;
      }
      else {
        bVar1 = ProcessAffineFactors(this,&aeL,&aeL);
        iVar3 = 1000;
        if (bVar1) {
          iVar3 = QVar2 * 2;
        }
      }
    }
    LinTerms::~LinTerms(&aeL.super_LinTerms);
  }
  return iVar3;
}

Assistant:

QP2PassNodeResult QP2PassVisitor::DoVisitPow2(
    Expr expr) {
  auto isc = IsConst(expr);
  if (isc.first) {
    DoAddConst(factor_ * isc.second * isc.second);
    return 0;
  }
  AffineExpr aeL;
  int degL = VisitAtmostAffine(expr, aeL);
  if (degL*2 > mode_)
    return 1000;               // abort top-level term
  if (!degL) {                 // can happen
    DoAddConst(factor_
               * aeL.constant_term() * aeL.constant_term());
    return 0;
  }
  if (!ProcessAffineFactors(aeL, aeL))
    return 1000;
  return degL*2;
}